

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

bool __thiscall Container::is_oom_killed(Container *this)

{
  CgroupController *pCVar1;
  bool bVar2;
  istream *piVar3;
  ContextManager *pCVar4;
  size_t in_RCX;
  allocator<char> local_231;
  string name;
  string val;
  allocator<char> local_1f0 [32];
  string data;
  stringstream sstream;
  
  pCVar1 = this->memory_controller_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sstream,"memory.oom_control",(allocator<char> *)&name);
  CgroupController::read((CgroupController *)&data,(int)pCVar1,&sstream,in_RCX);
  std::__cxx11::string::~string((string *)&sstream);
  pCVar1 = this->memory_controller_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&val,"memory.oom_control",local_1f0);
  CgroupController::read((CgroupController *)&name,(int)pCVar1,&val,in_RCX);
  std::__cxx11::stringstream::stringstream((stringstream *)&sstream,(string *)&name,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&val);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  val.field_2._M_local_buf[0] = '\0';
  do {
    piVar3 = std::operator>>((istream *)&sstream,(string *)&name);
    piVar3 = std::operator>>(piVar3,(string *)&val);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      pCVar4 = ContextManager::get();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0,"Can\'t find oom_kill field in memory.oom_control",&local_231);
      (**pCVar4->_vptr_ContextManager)(pCVar4,local_1f0);
      std::__cxx11::string::~string((string *)local_1f0);
      _exit(-1);
    }
    bVar2 = std::operator==(&name,"oom_kill");
  } while (!bVar2);
  bVar2 = std::operator!=(&val,"0");
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
  std::__cxx11::string::~string((string *)&data);
  return bVar2;
}

Assistant:

bool Container::is_oom_killed() {
    std::string data = memory_controller_->read("memory.oom_control");
    std::stringstream sstream(memory_controller_->read("memory.oom_control"));
    std::string name, val;
    while (sstream >> name >> val) {
        if (name == "oom_kill") {
            return (val != "0");
        }
    }
    die("Can't find oom_kill field in memory.oom_control");
    _exit(-1); // we should not get here
}